

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O1

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  ushort uVar4;
  size_t byte_ix;
  Command *pCVar5;
  void *pvVar6;
  ulong uVar7;
  uint8_t *puVar8;
  HistogramLiteral *pHVar9;
  uint32_t *puVar10;
  uint16_t *puVar11;
  HistogramCommand *pHVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ushort *puVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  HistogramDistance *pHVar20;
  uint32_t *puVar21;
  uint32_t *puVar22;
  int iVar23;
  size_t sVar24;
  size_t sVar25;
  long lVar26;
  ulong uVar27;
  uint32_t uVar28;
  byte *pbVar29;
  size_t block_idx_1;
  uint *puVar30;
  void *pvVar31;
  byte bVar32;
  uint uVar33;
  byte bVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  size_t __n;
  uint uVar38;
  size_t __n_00;
  uint *puVar39;
  size_t block_idx;
  long lVar40;
  void *pvVar41;
  long lVar42;
  ulong uVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  ulong local_ff0;
  HistogramCommand *local_fe8;
  uint32_t *local_fe0;
  void *local_fd8;
  HistogramCommand *local_fd0;
  HistogramDistance *local_fc8;
  ulong local_fb8;
  void *local_fb0;
  ulong local_fa8;
  uint32_t *local_fa0;
  void *local_f98;
  HistogramDistance *local_f90;
  long local_f88;
  uint32_t *local_f80;
  HistogramCommand *local_f78;
  HistogramLiteral *local_f70;
  HistogramPair *local_f68;
  HistogramPair *local_f50;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [1032];
  double local_738;
  ulong local_2c0;
  double local_2b8;
  ulong local_40;
  double local_38;
  
  if (num_commands == 0) {
    sVar35 = 0;
  }
  else {
    sVar35 = 0;
    pCVar5 = cmds;
    sVar24 = num_commands;
    do {
      sVar35 = sVar35 + pCVar5->insert_len_;
      pCVar5 = pCVar5 + 1;
      sVar24 = sVar24 - 1;
    } while (sVar24 != 0);
  }
  if (sVar35 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = BrotliAllocate(m,sVar35);
  }
  if (num_commands != 0) {
    puVar10 = &cmds->copy_len_;
    lVar40 = 0;
    sVar24 = num_commands;
    do {
      uVar43 = pos & mask;
      __n = (size_t)((Command *)(puVar10 + -1))->insert_len_;
      if (mask < uVar43 + __n) {
        __n_00 = (mask + 1) - uVar43;
        memcpy((void *)((long)pvVar6 + lVar40),data + uVar43,__n_00);
        lVar40 = lVar40 + __n_00;
        __n = __n - __n_00;
        uVar43 = 0;
      }
      if (__n != 0) {
        memcpy((void *)(lVar40 + (long)pvVar6),data + uVar43,__n);
        lVar40 = lVar40 + __n;
      }
      pos = (ulong)(*puVar10 & 0x1ffffff) + __n + uVar43;
      puVar10 = puVar10 + 4;
      sVar24 = sVar24 - 1;
    } while (sVar24 != 0);
  }
  uVar43 = 100;
  if (sVar35 < 0xd480) {
    uVar43 = sVar35 / 0x220 + 1;
  }
  if (sVar35 == 0) {
    literal_split->num_types = 1;
  }
  else if (sVar35 < 0x80) {
    uVar43 = literal_split->types_alloc_size;
    uVar7 = literal_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar13 = uVar43;
        uVar43 = uVar13 * 2;
      } while (uVar13 < uVar7);
      if (uVar13 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar13);
      }
      if (literal_split->types_alloc_size != 0) {
        memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar8;
      literal_split->types_alloc_size = uVar13;
    }
    uVar43 = literal_split->lengths_alloc_size;
    uVar7 = literal_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar13 = uVar43;
        uVar43 = uVar13 * 2;
      } while (uVar13 < uVar7);
      if (uVar13 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      }
      if (literal_split->lengths_alloc_size != 0) {
        memcpy(puVar10,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar10;
      literal_split->lengths_alloc_size = uVar13;
    }
    literal_split->num_types = 1;
    literal_split->types[literal_split->num_blocks] = '\0';
    sVar24 = literal_split->num_blocks;
    literal_split->lengths[sVar24] = (uint32_t)sVar35;
    literal_split->num_blocks = sVar24 + 1;
  }
  else {
    pvVar17 = BrotliAllocate(m,uVar43 * 0x410);
    uVar7 = uVar43;
    pvVar14 = pvVar17;
    do {
      memset(pvVar14,0,0x408);
      *(undefined8 *)((long)pvVar14 + 0x408) = 0x7ff0000000000000;
      pvVar14 = (void *)((long)pvVar14 + 0x410);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar13 = 0;
    uVar7 = 7;
    do {
      uVar36 = (uVar13 * sVar35) / uVar43;
      if (uVar13 != 0) {
        uVar7 = (ulong)(uint)((int)uVar7 * 0x41a7);
        uVar36 = uVar36 + uVar7 % (sVar35 / uVar43);
      }
      if (sVar35 <= uVar36 + 0x46) {
        uVar36 = sVar35 - 0x47;
      }
      plVar2 = (long *)((long)pvVar17 + uVar13 * 0x410 + 0x400);
      *plVar2 = *plVar2 + 0x46;
      lVar40 = -0x46;
      do {
        piVar1 = (int *)((long)pvVar17 +
                        (ulong)*(byte *)((long)pvVar6 + lVar40 + uVar36 + 0x46) * 4 + uVar13 * 0x410
                        );
        *piVar1 = *piVar1 + 1;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar43);
    uVar7 = (sVar35 * 2) / 0x46 + uVar43 + 99;
    if (uVar7 != uVar7 % uVar43) {
      uVar36 = 7;
      uVar13 = 0;
      do {
        memset(local_b40,0,0x408);
        local_738 = INFINITY;
        uVar36 = (ulong)(uint)((int)uVar36 * 0x41a7);
        pbVar29 = (byte *)(uVar36 % (sVar35 - 0x45) + (long)pvVar6);
        local_b40._1024_8_ = 0x46;
        lVar40 = -0x46;
        do {
          bVar32 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          *(int *)(local_b40 + (ulong)bVar32 * 4) = *(int *)(local_b40 + (ulong)bVar32 * 4) + 1;
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0);
        lVar40 = (uVar13 % uVar43) * 0x410;
        plVar2 = (long *)((long)pvVar17 + lVar40 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar26 = 0;
        do {
          piVar1 = (int *)((long)pvVar17 + lVar26 * 4 + lVar40);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x100);
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar7 - uVar7 % uVar43);
    }
    pvVar14 = BrotliAllocate(m,sVar35);
    pvVar18 = BrotliAllocate(m,uVar43 << 0xb);
    pvVar19 = BrotliAllocate(m,uVar43 * 8);
    sVar24 = (uVar43 + 7 >> 3) * sVar35;
    if (sVar24 == 0) {
      local_f98 = (void *)0x0;
    }
    else {
      local_f98 = BrotliAllocate(m,sVar24);
    }
    pvVar31 = BrotliAllocate(m,uVar43 * 2);
    lVar40 = 3;
    if (10 < params->quality) {
      lVar40 = 10;
    }
    sVar24 = sVar35 - 1;
    lVar26 = 0;
    do {
      if (uVar43 < 2) {
        memset(pvVar14,0,sVar35);
LAB_0010f5f8:
        uVar13 = 1;
      }
      else {
        uVar7 = uVar43 + 7 >> 3;
        memset(pvVar18,0,uVar43 << 0xb);
        uVar13 = 0;
        puVar30 = (uint *)((long)pvVar17 + 0x400);
        do {
          uVar36 = (ulong)*puVar30;
          if (uVar36 < 0x100) {
            dVar45 = (double)kLog2Table[uVar36];
          }
          else {
            dVar45 = log2((double)uVar36);
          }
          *(double *)((long)pvVar18 + uVar13 * 8) = dVar45;
          uVar13 = uVar13 + 1;
          puVar30 = puVar30 + 0x104;
        } while (uVar43 != uVar13);
        pvVar41 = (void *)(uVar43 * 0x7f8 + (long)pvVar18);
        lVar42 = 0x100;
        puVar30 = (uint *)((long)pvVar17 + 0x3fc);
        do {
          lVar42 = lVar42 + -1;
          uVar13 = 0;
          puVar39 = puVar30;
          do {
            dVar45 = *(double *)((long)pvVar18 + uVar13 * 8);
            uVar36 = (ulong)*puVar39;
            dVar44 = -2.0;
            if (uVar36 != 0) {
              if (*puVar39 < 0x100) {
                dVar44 = (double)kLog2Table[uVar36];
              }
              else {
                dVar44 = log2((double)uVar36);
              }
            }
            *(double *)((long)pvVar41 + uVar13 * 8) = dVar45 - dVar44;
            uVar13 = uVar13 + 1;
            puVar39 = puVar39 + 0x104;
          } while (uVar43 != uVar13);
          pvVar41 = (void *)((long)pvVar41 + uVar43 * -8);
          puVar30 = puVar30 + -1;
        } while (lVar42 != 0);
        memset(pvVar19,0,uVar43 * 8);
        memset(local_f98,0,uVar7 * sVar35);
        uVar13 = 0;
        do {
          bVar32 = *(byte *)((long)pvVar6 + uVar13);
          uVar36 = 0;
          dVar45 = 1e+99;
          do {
            dVar44 = *(double *)((long)pvVar18 + uVar36 * 8 + bVar32 * uVar43 * 8) +
                     *(double *)((long)pvVar19 + uVar36 * 8);
            *(double *)((long)pvVar19 + uVar36 * 8) = dVar44;
            if (dVar44 < dVar45) {
              *(char *)((long)pvVar14 + uVar13) = (char)uVar36;
              dVar45 = dVar44;
            }
            uVar36 = uVar36 + 1;
          } while (uVar43 != uVar36);
          dVar44 = 28.1;
          if (uVar13 < 2000) {
            dVar44 = (((double)(long)uVar13 * 0.07) / 2000.0 + 0.77) * 28.1;
          }
          uVar36 = 0;
          do {
            dVar46 = *(double *)((long)pvVar19 + uVar36 * 8) - dVar45;
            *(double *)((long)pvVar19 + uVar36 * 8) = dVar46;
            if (dVar44 <= dVar46) {
              *(double *)((long)pvVar19 + uVar36 * 8) = dVar44;
              pbVar29 = (byte *)((long)local_f98 + (uVar36 >> 3) + uVar13 * uVar7);
              *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar36 & 7);
            }
            uVar36 = uVar36 + 1;
          } while (uVar43 != uVar36);
          uVar13 = uVar13 + 1;
        } while (uVar13 != sVar35);
        if (sVar24 == 0) goto LAB_0010f5f8;
        bVar32 = *(byte *)((long)pvVar14 + sVar24);
        pvVar41 = (void *)((sVar35 - 2) * uVar7 + (long)local_f98);
        uVar13 = 1;
        sVar25 = sVar35;
        do {
          if ((*(byte *)((long)pvVar41 + (ulong)(bVar32 >> 3)) >> (bVar32 & 7) & 1) != 0) {
            bVar34 = *(byte *)((long)pvVar14 + (sVar25 - 2));
            uVar13 = uVar13 + (bVar32 != bVar34);
            bVar32 = bVar34;
          }
          *(byte *)((long)pvVar14 + (sVar25 - 2)) = bVar32;
          pvVar41 = (void *)((long)pvVar41 - uVar7);
          sVar25 = sVar25 - 1;
        } while (sVar25 != 1);
      }
      if (uVar43 != 0) {
        uVar7 = 0;
        do {
          *(undefined2 *)((long)pvVar31 + uVar7 * 2) = 0x100;
          uVar7 = uVar7 + 1;
        } while (uVar43 != uVar7);
      }
      sVar25 = 0;
      uVar4 = 0;
      do {
        if (*(short *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar14 + sVar25) * 2) == 0x100) {
          *(ushort *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar14 + sVar25) * 2) = uVar4;
          uVar4 = uVar4 + 1;
        }
        sVar25 = sVar25 + 1;
      } while (sVar35 != sVar25);
      sVar25 = 0;
      do {
        *(undefined1 *)((long)pvVar14 + sVar25) =
             *(undefined1 *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar14 + sVar25) * 2);
        sVar25 = sVar25 + 1;
      } while (sVar35 != sVar25);
      uVar43 = (ulong)uVar4;
      if (uVar4 != 0) {
        lVar42 = 0;
        do {
          memset((void *)((long)pvVar17 + lVar42),0,0x408);
          *(undefined8 *)((long)pvVar17 + lVar42 + 0x408) = 0x7ff0000000000000;
          lVar42 = lVar42 + 0x410;
        } while (uVar43 * 0x410 != lVar42);
      }
      sVar25 = 0;
      do {
        lVar42 = (ulong)*(byte *)((long)pvVar14 + sVar25) * 0x410;
        piVar1 = (int *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar6 + sVar25) * 4 + lVar42);
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar17 + lVar42 + 0x400);
        *plVar2 = *plVar2 + 1;
        sVar25 = sVar25 + 1;
      } while (sVar35 != sVar25);
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar40);
    BrotliFree(m,pvVar18);
    BrotliFree(m,pvVar19);
    BrotliFree(m,local_f98);
    BrotliFree(m,pvVar31);
    BrotliFree(m,pvVar17);
    if (uVar13 == 0) {
      local_f80 = (uint32_t *)0x0;
      pvVar17 = (void *)0x0;
    }
    else {
      local_f80 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      pvVar17 = BrotliAllocate(m,uVar13 * 4);
    }
    uVar7 = uVar13 * 0x10 + 0x3f0;
    uVar43 = uVar7 >> 6;
    if (uVar7 < 0x40) {
      local_f70 = (HistogramLiteral *)0x0;
      puVar10 = (uint32_t *)0x0;
    }
    else {
      local_f70 = (HistogramLiteral *)BrotliAllocate(m,uVar43 * 0x410);
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
    }
    if (uVar13 == 0) {
      local_fd0 = (HistogramCommand *)0x0;
    }
    else {
      uVar7 = 0x40;
      if (uVar13 < 0x40) {
        uVar7 = uVar13;
      }
      local_fd0 = (HistogramCommand *)BrotliAllocate(m,uVar7 * 0x410);
    }
    local_f68 = (HistogramPair *)BrotliAllocate(m,0xc018);
    lVar40 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar17,0,uVar13 * 4);
    sVar25 = 0;
    do {
      piVar1 = (int *)((long)pvVar17 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if ((sVar24 == sVar25) ||
         (*(char *)((long)pvVar14 + sVar25) != *(char *)((long)pvVar14 + sVar25 + 1))) {
        lVar40 = lVar40 + 1;
      }
      sVar25 = sVar25 + 1;
    } while (sVar35 != sVar25);
    if (uVar13 == 0) {
      local_fe0 = (uint32_t *)0x0;
    }
    else {
      local_f90 = (HistogramDistance *)0x0;
      local_fb0 = (void *)0x0;
      local_fb8 = 0;
      local_fe0 = (uint32_t *)0x0;
      local_ff0 = 0;
      uVar7 = uVar13;
      puVar22 = local_f80;
      local_f98 = (void *)uVar43;
      do {
        uVar36 = 0x40;
        if (uVar7 < 0x40) {
          uVar36 = uVar7;
        }
        lVar40 = uVar36 + (uVar36 == 0);
        lVar26 = 0;
        do {
          pHVar9 = (HistogramLiteral *)((long)local_fd0 + lVar26 * 0x410);
          memset(pHVar9,0,0x408);
          ((HistogramLiteral *)((long)local_fd0 + lVar26 * 0x410))->bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar17 + (local_fb8 + lVar26) * 4) != 0) {
            sVar35 = pHVar9->total_count_;
            uVar36 = 0;
            do {
              pHVar9->data_[*(byte *)((long)pvVar6 + uVar36 + local_ff0)] =
                   pHVar9->data_[*(byte *)((long)pvVar6 + uVar36 + local_ff0)] + 1;
              pHVar9->total_count_ = sVar35 + 1 + uVar36;
              uVar36 = uVar36 + 1;
            } while (uVar36 < *(uint *)((long)pvVar17 + (local_fb8 + lVar26) * 4));
            local_ff0 = local_ff0 + uVar36;
          }
          dVar45 = BrotliPopulationCostLiteral(pHVar9);
          pHVar9->bit_cost_ = dVar45;
          new_clusters[lVar26] = (uint32_t)lVar26;
          symbols[lVar26] = (uint32_t)lVar26;
          sizes[lVar26] = 1;
          lVar26 = lVar26 + 1;
        } while (lVar26 != lVar40);
        sVar35 = uVar13 - local_fb8;
        if (0x3f < sVar35) {
          sVar35 = 0x40;
        }
        sVar35 = BrotliHistogramCombineLiteral
                           ((HistogramLiteral *)local_fd0,sizes,symbols,new_clusters,local_f68,
                            sVar35,sVar35,0x40,0x800);
        uVar36 = (long)local_f90 + sVar35;
        if (local_f98 < uVar36) {
          pvVar18 = local_f98;
          if (local_f98 == (void *)0x0) {
            pvVar18 = (void *)uVar36;
          }
          do {
            uVar15 = (ulong)pvVar18;
            pvVar18 = (void *)(uVar15 * 2);
          } while (uVar15 < uVar36);
          if (uVar15 == 0) {
            pHVar9 = (HistogramLiteral *)0x0;
          }
          else {
            pHVar9 = (HistogramLiteral *)BrotliAllocate(m,uVar15 * 0x410);
          }
          if (local_f98 != (void *)0x0) {
            memcpy(pHVar9,local_f70,(long)local_f98 * 0x410);
          }
          BrotliFree(m,local_f70);
          local_f98 = (void *)uVar15;
          local_f70 = pHVar9;
        }
        uVar36 = (long)local_fb0 + sVar35;
        if (uVar43 < uVar36) {
          uVar15 = uVar43;
          if (uVar43 == 0) {
            uVar15 = uVar36;
          }
          do {
            uVar37 = uVar15;
            uVar15 = uVar37 * 2;
          } while (uVar37 < uVar36);
          if (uVar37 == 0) {
            puVar21 = (uint32_t *)0x0;
          }
          else {
            puVar21 = (uint32_t *)BrotliAllocate(m,uVar37 * 4);
          }
          if (uVar43 != 0) {
            memcpy(puVar21,puVar10,uVar43 << 2);
          }
          BrotliFree(m,puVar10);
          uVar43 = uVar37;
          puVar10 = puVar21;
        }
        if (sVar35 != 0) {
          pHVar9 = local_f70 + (long)local_f90;
          sVar24 = 0;
          do {
            uVar38 = new_clusters[sVar24];
            memcpy(pHVar9,(HistogramLiteral *)((long)local_fd0 + (ulong)uVar38 * 0x410),0x410);
            puVar10[(long)local_fb0 + sVar24] = sizes[uVar38];
            remap[new_clusters[sVar24]] = (uint32_t)sVar24;
            sVar24 = sVar24 + 1;
            pHVar9 = pHVar9 + 1;
          } while (sVar35 != sVar24);
          local_f90 = (HistogramDistance *)((long)local_f90 + sVar24);
          local_fb0 = (void *)((long)local_fb0 + sVar24);
        }
        lVar26 = 0;
        do {
          puVar22[lVar26] = remap[symbols[lVar26]] + (int)local_fe0;
          lVar26 = lVar26 + 1;
        } while (lVar40 != lVar26);
        local_fe0 = (uint32_t *)((long)local_fe0 + sVar35);
        local_fb8 = local_fb8 + 0x40;
        uVar7 = uVar7 - 0x40;
        puVar22 = puVar22 + 0x40;
      } while (local_fb8 < uVar13);
    }
    BrotliFree(m,local_fd0);
    uVar43 = ((ulong)local_fe0 >> 1) * (long)local_fe0;
    if ((ulong)((long)local_fe0 << 6) < uVar43) {
      uVar43 = (long)local_fe0 << 6;
    }
    if (0x800 < uVar43) {
      BrotliFree(m,local_f68);
      local_f68 = (HistogramPair *)BrotliAllocate(m,uVar43 * 0x18 + 0x18);
    }
    if (local_fe0 == (uint32_t *)0x0) {
      puVar22 = (uint32_t *)0x0;
    }
    else {
      puVar22 = (uint32_t *)BrotliAllocate(m,(long)local_fe0 * 4);
      uVar7 = 0;
      do {
        puVar22[uVar7] = (uint32_t)uVar7;
        uVar7 = uVar7 + 1;
      } while (local_fe0 != (uint32_t *)uVar7);
    }
    sVar35 = BrotliHistogramCombineLiteral
                       (local_f70,puVar10,local_f80,puVar22,local_f68,(size_t)local_fe0,uVar13,0x100
                        ,uVar43);
    BrotliFree(m,local_f68);
    BrotliFree(m,puVar10);
    if (local_fe0 == (uint32_t *)0x0) {
      pvVar18 = (void *)0x0;
    }
    else {
      pvVar18 = BrotliAllocate(m,(long)local_fe0 * 4);
      memset(pvVar18,0xff,(long)local_fe0 << 2);
    }
    if (uVar13 != 0) {
      iVar23 = 0;
      uVar43 = 0;
      local_fb8 = 0;
      do {
        memset(local_b40,0,0x408);
        local_738 = INFINITY;
        if (*(int *)((long)pvVar17 + uVar43 * 4) != 0) {
          uVar7 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(byte *)((long)pvVar6 + uVar7 + local_fb8) * 4) =
                 *(int *)(local_b40 + (ulong)*(byte *)((long)pvVar6 + uVar7 + local_fb8) * 4) + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)((long)pvVar17 + uVar43 * 4));
          local_fb8 = local_fb8 + uVar7;
          local_b40._1024_8_ = uVar7;
        }
        lVar40 = 0;
        if (uVar43 != 0) {
          lVar40 = uVar43 - 1;
        }
        uVar38 = local_f80[lVar40];
        uVar7 = (ulong)uVar38;
        local_fd0 = (HistogramCommand *)
                    BrotliHistogramBitCostDistanceLiteral
                              ((HistogramLiteral *)local_b40,local_f70 + uVar7);
        if (sVar35 != 0) {
          sVar24 = 0;
          do {
            dVar45 = BrotliHistogramBitCostDistanceLiteral
                               ((HistogramLiteral *)local_b40,local_f70 + puVar22[sVar24]);
            if (dVar45 < (double)local_fd0) {
              uVar7 = (ulong)puVar22[sVar24];
              local_fd0 = (HistogramCommand *)dVar45;
            }
            uVar38 = (uint)uVar7;
            sVar24 = sVar24 + 1;
          } while (sVar35 != sVar24);
        }
        local_f80[uVar43] = uVar38;
        if (*(int *)((long)pvVar18 + (ulong)uVar38 * 4) == -1) {
          *(int *)((long)pvVar18 + (ulong)uVar38 * 4) = iVar23;
          iVar23 = iVar23 + 1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != uVar13);
    }
    BrotliFree(m,puVar22);
    BrotliFree(m,local_f70);
    uVar43 = literal_split->types_alloc_size;
    if (uVar43 < uVar13) {
      if (uVar43 == 0) {
        uVar43 = uVar13;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar13);
      if (uVar7 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar7);
      }
      if (literal_split->types_alloc_size != 0) {
        memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar8;
      literal_split->types_alloc_size = uVar7;
    }
    uVar43 = literal_split->lengths_alloc_size;
    if (uVar43 < uVar13) {
      if (uVar43 == 0) {
        uVar43 = uVar13;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar13);
      if (uVar7 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      }
      if (literal_split->lengths_alloc_size != 0) {
        memcpy(puVar10,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar10;
      literal_split->lengths_alloc_size = uVar7;
    }
    uVar28 = 0;
    if (uVar13 == 0) {
      sVar24 = 1;
      sVar35 = 0;
    }
    else {
      uVar38 = 0;
      sVar35 = 0;
      uVar43 = 0;
      do {
        uVar28 = uVar28 + *(int *)((long)pvVar17 + uVar43 * 4);
        if ((uVar13 - 1 == uVar43) || (local_f80[uVar43] != local_f80[uVar43 + 1])) {
          uVar33 = uVar38 & 0xff;
          uVar3 = *(uint *)((long)pvVar18 + (ulong)local_f80[uVar43] * 4);
          bVar34 = (byte)uVar3;
          literal_split->types[sVar35] = bVar34;
          bVar32 = (byte)uVar38;
          uVar38 = uVar3;
          if (bVar34 < bVar32) {
            uVar38 = uVar33;
          }
          literal_split->lengths[sVar35] = uVar28;
          sVar35 = sVar35 + 1;
          uVar28 = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar13 != uVar43);
      sVar24 = (ulong)(uVar38 & 0xff) + 1;
    }
    literal_split->num_blocks = sVar35;
    literal_split->num_types = sVar24;
    BrotliFree(m,pvVar18);
    BrotliFree(m,pvVar17);
    BrotliFree(m,local_f80);
    BrotliFree(m,pvVar14);
  }
  BrotliFree(m,pvVar6);
  if (num_commands == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = BrotliAllocate(m,num_commands * 2);
    puVar11 = &cmds->cmd_prefix_;
    sVar35 = 0;
    do {
      *(uint16_t *)((long)pvVar6 + sVar35 * 2) = *puVar11;
      sVar35 = sVar35 + 1;
      puVar11 = puVar11 + 8;
    } while (num_commands != sVar35);
  }
  uVar43 = 0x32;
  if (num_commands < 0x6784) {
    uVar43 = num_commands / 0x212 + 1;
  }
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
  }
  else if (num_commands < 0x80) {
    uVar43 = insert_and_copy_split->types_alloc_size;
    uVar7 = insert_and_copy_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar13 = uVar43;
        uVar43 = uVar13 * 2;
      } while (uVar13 < uVar7);
      if (uVar13 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar13);
      }
      if (insert_and_copy_split->types_alloc_size != 0) {
        memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar8;
      insert_and_copy_split->types_alloc_size = uVar13;
    }
    uVar43 = insert_and_copy_split->lengths_alloc_size;
    uVar7 = insert_and_copy_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar13 = uVar43;
        uVar43 = uVar13 * 2;
      } while (uVar13 < uVar7);
      if (uVar13 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      }
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        memcpy(puVar10,insert_and_copy_split->lengths,insert_and_copy_split->lengths_alloc_size << 2
              );
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar10;
      insert_and_copy_split->lengths_alloc_size = uVar13;
    }
    insert_and_copy_split->num_types = 1;
    insert_and_copy_split->types[insert_and_copy_split->num_blocks] = '\0';
    sVar35 = insert_and_copy_split->num_blocks;
    insert_and_copy_split->lengths[sVar35] = (uint32_t)num_commands;
    insert_and_copy_split->num_blocks = sVar35 + 1;
  }
  else {
    pvVar17 = BrotliAllocate(m,uVar43 * 0xb10);
    pvVar14 = pvVar17;
    uVar7 = uVar43;
    do {
      memset(pvVar14,0,0xb08);
      *(undefined8 *)((long)pvVar14 + 0xb08) = 0x7ff0000000000000;
      pvVar14 = (void *)((long)pvVar14 + 0xb10);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar13 = 0;
    uVar7 = 7;
    do {
      uVar36 = (uVar13 * num_commands) / uVar43;
      if (uVar13 != 0) {
        uVar7 = (ulong)(uint)((int)uVar7 * 0x41a7);
        uVar36 = uVar36 + uVar7 % (num_commands / uVar43);
      }
      if (num_commands <= uVar36 + 0x28) {
        uVar36 = num_commands - 0x29;
      }
      plVar2 = (long *)((long)pvVar17 + uVar13 * 0xb10 + 0xb00);
      *plVar2 = *plVar2 + 0x28;
      lVar40 = 0;
      do {
        piVar1 = (int *)((long)pvVar17 +
                        (ulong)*(ushort *)((long)pvVar6 + lVar40 * 2 + uVar36 * 2) * 4 +
                        uVar13 * 0xb10);
        *piVar1 = *piVar1 + 1;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0x28);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar43);
    uVar7 = (num_commands * 2) / 0x28 + uVar43 + 99;
    if (uVar7 != uVar7 % uVar43) {
      uVar36 = 7;
      uVar13 = 0;
      do {
        memset(local_b40,0,0xb08);
        local_38 = INFINITY;
        uVar36 = (ulong)(uint)((int)uVar36 * 0x41a7);
        puVar16 = (ushort *)((long)pvVar6 + (uVar36 % (num_commands - 0x27)) * 2);
        local_40 = 0x28;
        lVar40 = -0x28;
        do {
          uVar4 = *puVar16;
          puVar16 = puVar16 + 1;
          *(int *)(local_b40 + (ulong)uVar4 * 4) = *(int *)(local_b40 + (ulong)uVar4 * 4) + 1;
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0);
        lVar40 = (uVar13 % uVar43) * 0xb10;
        plVar2 = (long *)((long)pvVar17 + lVar40 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar26 = 0;
        do {
          piVar1 = (int *)((long)pvVar17 + lVar26 * 4 + lVar40);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x2c0);
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar7 - uVar7 % uVar43);
    }
    pvVar14 = BrotliAllocate(m,num_commands);
    pvVar18 = BrotliAllocate(m,uVar43 * 0x1600);
    pvVar19 = BrotliAllocate(m,uVar43 * 8);
    sVar35 = (uVar43 + 7 >> 3) * num_commands;
    if (sVar35 == 0) {
      local_fb0 = (void *)0x0;
    }
    else {
      local_fb0 = BrotliAllocate(m,sVar35);
    }
    pvVar31 = BrotliAllocate(m,uVar43 * 2);
    lVar40 = 3;
    if (10 < params->quality) {
      lVar40 = 10;
    }
    sVar35 = num_commands - 1;
    lVar26 = 0;
    do {
      if (uVar43 < 2) {
        memset(pvVar14,0,num_commands);
LAB_00110882:
        uVar13 = 1;
      }
      else {
        uVar7 = uVar43 + 7 >> 3;
        memset(pvVar18,0,uVar43 * 0x1600);
        uVar13 = 0;
        puVar30 = (uint *)((long)pvVar17 + 0xb00);
        do {
          uVar36 = (ulong)*puVar30;
          if (uVar36 < 0x100) {
            dVar45 = (double)kLog2Table[uVar36];
          }
          else {
            dVar45 = log2((double)uVar36);
          }
          *(double *)((long)pvVar18 + uVar13 * 8) = dVar45;
          uVar13 = uVar13 + 1;
          puVar30 = puVar30 + 0x2c4;
        } while (uVar43 != uVar13);
        pvVar41 = (void *)(uVar43 * 0x15f8 + (long)pvVar18);
        lVar42 = 0x2c0;
        puVar30 = (uint *)((long)pvVar17 + 0xafc);
        do {
          lVar42 = lVar42 + -1;
          uVar13 = 0;
          puVar39 = puVar30;
          do {
            dVar45 = *(double *)((long)pvVar18 + uVar13 * 8);
            uVar36 = (ulong)*puVar39;
            dVar44 = -2.0;
            if (uVar36 != 0) {
              if (*puVar39 < 0x100) {
                dVar44 = (double)kLog2Table[uVar36];
              }
              else {
                dVar44 = log2((double)uVar36);
              }
            }
            *(double *)((long)pvVar41 + uVar13 * 8) = dVar45 - dVar44;
            uVar13 = uVar13 + 1;
            puVar39 = puVar39 + 0x2c4;
          } while (uVar43 != uVar13);
          pvVar41 = (void *)((long)pvVar41 + uVar43 * -8);
          puVar30 = puVar30 + -1;
        } while (lVar42 != 0);
        memset(pvVar19,0,uVar43 * 8);
        memset(local_fb0,0,uVar7 * num_commands);
        uVar13 = 0;
        do {
          uVar4 = *(ushort *)((long)pvVar6 + uVar13 * 2);
          uVar36 = 0;
          dVar45 = 1e+99;
          do {
            dVar44 = *(double *)((long)pvVar18 + uVar36 * 8 + uVar4 * uVar43 * 8) +
                     *(double *)((long)pvVar19 + uVar36 * 8);
            *(double *)((long)pvVar19 + uVar36 * 8) = dVar44;
            if (dVar44 < dVar45) {
              *(char *)((long)pvVar14 + uVar13) = (char)uVar36;
              dVar45 = dVar44;
            }
            uVar36 = uVar36 + 1;
          } while (uVar43 != uVar36);
          dVar44 = 13.5;
          if (uVar13 < 2000) {
            dVar44 = (((double)(long)uVar13 * 0.07) / 2000.0 + 0.77) * 13.5;
          }
          uVar36 = 0;
          do {
            dVar46 = *(double *)((long)pvVar19 + uVar36 * 8) - dVar45;
            *(double *)((long)pvVar19 + uVar36 * 8) = dVar46;
            if (dVar44 <= dVar46) {
              *(double *)((long)pvVar19 + uVar36 * 8) = dVar44;
              pbVar29 = (byte *)((long)local_fb0 + (uVar36 >> 3) + uVar13 * uVar7);
              *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar36 & 7);
            }
            uVar36 = uVar36 + 1;
          } while (uVar43 != uVar36);
          uVar13 = uVar13 + 1;
        } while (uVar13 != num_commands);
        if (sVar35 == 0) goto LAB_00110882;
        bVar32 = *(byte *)((long)pvVar14 + sVar35);
        pvVar41 = (void *)((num_commands - 2) * uVar7 + (long)local_fb0);
        uVar13 = 1;
        sVar24 = num_commands;
        do {
          if ((*(byte *)((long)pvVar41 + (ulong)(bVar32 >> 3)) >> (bVar32 & 7) & 1) != 0) {
            bVar34 = *(byte *)((long)pvVar14 + (sVar24 - 2));
            uVar13 = uVar13 + (bVar32 != bVar34);
            bVar32 = bVar34;
          }
          *(byte *)((long)pvVar14 + (sVar24 - 2)) = bVar32;
          pvVar41 = (void *)((long)pvVar41 - uVar7);
          sVar24 = sVar24 - 1;
        } while (sVar24 != 1);
      }
      if (uVar43 != 0) {
        uVar7 = 0;
        do {
          *(undefined2 *)((long)pvVar31 + uVar7 * 2) = 0x100;
          uVar7 = uVar7 + 1;
        } while (uVar43 != uVar7);
      }
      sVar24 = 0;
      uVar4 = 0;
      do {
        if (*(short *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar14 + sVar24) * 2) == 0x100) {
          *(ushort *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar14 + sVar24) * 2) = uVar4;
          uVar4 = uVar4 + 1;
        }
        sVar24 = sVar24 + 1;
      } while (num_commands != sVar24);
      sVar24 = 0;
      do {
        *(undefined1 *)((long)pvVar14 + sVar24) =
             *(undefined1 *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar14 + sVar24) * 2);
        sVar24 = sVar24 + 1;
      } while (num_commands != sVar24);
      uVar43 = (ulong)uVar4;
      if (uVar4 != 0) {
        lVar42 = 0;
        do {
          memset((void *)((long)pvVar17 + lVar42),0,0xb08);
          *(undefined8 *)((long)pvVar17 + lVar42 + 0xb08) = 0x7ff0000000000000;
          lVar42 = lVar42 + 0xb10;
        } while (uVar43 * 0xb10 - lVar42 != 0);
      }
      sVar24 = 0;
      do {
        lVar42 = (ulong)*(byte *)((long)pvVar14 + sVar24) * 0xb10;
        piVar1 = (int *)((long)pvVar17 + (ulong)*(ushort *)((long)pvVar6 + sVar24 * 2) * 4 + lVar42)
        ;
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar17 + lVar42 + 0xb00);
        *plVar2 = *plVar2 + 1;
        sVar24 = sVar24 + 1;
      } while (num_commands != sVar24);
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar40);
    BrotliFree(m,pvVar18);
    BrotliFree(m,pvVar19);
    BrotliFree(m,local_fb0);
    BrotliFree(m,pvVar31);
    BrotliFree(m,pvVar17);
    if (uVar13 == 0) {
      local_fa0 = (uint32_t *)0x0;
      pvVar17 = (void *)0x0;
    }
    else {
      local_fa0 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      pvVar17 = BrotliAllocate(m,uVar13 * 4);
    }
    uVar7 = uVar13 * 0x10 + 0x3f0;
    uVar43 = uVar7 >> 6;
    if (uVar7 < 0x40) {
      local_fe8 = (HistogramCommand *)0x0;
      puVar10 = (uint32_t *)0x0;
    }
    else {
      local_fe8 = (HistogramCommand *)BrotliAllocate(m,uVar43 * 0xb10);
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
    }
    if (uVar13 == 0) {
      local_fd0 = (HistogramCommand *)0x0;
    }
    else {
      uVar7 = 0x40;
      if (uVar13 < 0x40) {
        uVar7 = uVar13;
      }
      local_fd0 = (HistogramCommand *)BrotliAllocate(m,uVar7 * 0xb10);
    }
    local_f50 = (HistogramPair *)BrotliAllocate(m,0xc018);
    lVar40 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar17,0,uVar13 * 4);
    sVar24 = 0;
    do {
      piVar1 = (int *)((long)pvVar17 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if ((sVar35 == sVar24) ||
         (*(char *)((long)pvVar14 + sVar24) != *(char *)((long)pvVar14 + sVar24 + 1))) {
        lVar40 = lVar40 + 1;
      }
      sVar24 = sVar24 + 1;
    } while (num_commands != sVar24);
    if (uVar13 == 0) {
      local_f90 = (HistogramDistance *)0x0;
    }
    else {
      local_f70 = (HistogramLiteral *)0x0;
      local_f78 = local_fe8;
      local_f88 = 0;
      local_fb8 = 0;
      local_f90 = (HistogramDistance *)0x0;
      local_ff0 = 0;
      uVar7 = uVar13;
      puVar22 = local_fa0;
      local_fb0 = (void *)uVar43;
      do {
        uVar36 = 0x40;
        if (uVar7 < 0x40) {
          uVar36 = uVar7;
        }
        lVar40 = uVar36 + (uVar36 == 0);
        lVar26 = 0;
        do {
          pHVar12 = local_fd0 + lVar26;
          memset(pHVar12,0,0xb08);
          local_fd0[lVar26].bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar17 + (local_fb8 + lVar26) * 4) != 0) {
            sVar35 = pHVar12->total_count_;
            uVar36 = 0;
            do {
              pHVar12->data_[*(ushort *)((long)pvVar6 + uVar36 * 2 + local_ff0 * 2)] =
                   pHVar12->data_[*(ushort *)((long)pvVar6 + uVar36 * 2 + local_ff0 * 2)] + 1;
              uVar36 = uVar36 + 1;
            } while (uVar36 < *(uint *)((long)pvVar17 + (local_fb8 + lVar26) * 4));
            pHVar12->total_count_ = sVar35 + uVar36;
            local_ff0 = local_ff0 + uVar36;
          }
          dVar45 = BrotliPopulationCostCommand(pHVar12);
          pHVar12->bit_cost_ = dVar45;
          new_clusters[lVar26] = (uint32_t)lVar26;
          symbols[lVar26] = (uint32_t)lVar26;
          sizes[lVar26] = 1;
          lVar26 = lVar26 + 1;
        } while (lVar26 != lVar40);
        sVar35 = uVar13 - local_fb8;
        if (0x3f < sVar35) {
          sVar35 = 0x40;
        }
        sVar35 = BrotliHistogramCombineCommand
                           (local_fd0,sizes,symbols,new_clusters,local_f50,sVar35,sVar35,0x40,0x800)
        ;
        uVar36 = (long)local_f70 + sVar35;
        if (local_fb0 < uVar36) {
          pvVar18 = local_fb0;
          if (local_fb0 == (void *)0x0) {
            pvVar18 = (void *)uVar36;
          }
          do {
            uVar15 = (ulong)pvVar18;
            pvVar18 = (void *)(uVar15 * 2);
          } while (uVar15 < uVar36);
          if (uVar15 == 0) {
            pHVar12 = (HistogramCommand *)0x0;
          }
          else {
            pHVar12 = (HistogramCommand *)BrotliAllocate(m,uVar15 * 0xb10);
          }
          if (local_fb0 != (void *)0x0) {
            memcpy(pHVar12,local_f78,(long)local_fb0 * 0xb10);
          }
          BrotliFree(m,local_f78);
          local_fb0 = (void *)uVar15;
          local_f78 = pHVar12;
        }
        uVar36 = local_f88 + sVar35;
        if (uVar43 < uVar36) {
          uVar15 = uVar43;
          if (uVar43 == 0) {
            uVar15 = uVar36;
          }
          do {
            uVar37 = uVar15;
            uVar15 = uVar37 * 2;
          } while (uVar37 < uVar36);
          if (uVar37 == 0) {
            puVar21 = (uint32_t *)0x0;
          }
          else {
            puVar21 = (uint32_t *)BrotliAllocate(m,uVar37 * 4);
          }
          if (uVar43 != 0) {
            memcpy(puVar21,puVar10,uVar43 << 2);
          }
          BrotliFree(m,puVar10);
          puVar10 = puVar21;
          uVar43 = uVar37;
        }
        if (sVar35 != 0) {
          pHVar12 = local_f78 + (long)local_f70;
          sVar24 = 0;
          do {
            uVar38 = new_clusters[sVar24];
            memcpy(pHVar12,local_fd0 + uVar38,0xb10);
            puVar10[local_f88 + sVar24] = sizes[uVar38];
            remap[new_clusters[sVar24]] = (uint32_t)sVar24;
            sVar24 = sVar24 + 1;
            pHVar12 = pHVar12 + 1;
          } while (sVar35 != sVar24);
          local_f70 = (HistogramLiteral *)((long)local_f70 + sVar24);
          local_f88 = local_f88 + sVar24;
        }
        lVar26 = 0;
        do {
          puVar22[lVar26] = remap[symbols[lVar26]] + (int)local_f90;
          lVar26 = lVar26 + 1;
        } while (lVar40 != lVar26);
        local_f90 = (HistogramDistance *)((long)local_f90 + sVar35);
        local_fb8 = local_fb8 + 0x40;
        uVar7 = uVar7 - 0x40;
        puVar22 = puVar22 + 0x40;
        local_fe8 = local_f78;
      } while (local_fb8 < uVar13);
    }
    BrotliFree(m,local_fd0);
    uVar43 = ((ulong)local_f90 >> 1) * (long)local_f90;
    if ((ulong)((long)local_f90 << 6) < uVar43) {
      uVar43 = (long)local_f90 << 6;
    }
    if (0x800 < uVar43) {
      BrotliFree(m,local_f50);
      local_f50 = (HistogramPair *)BrotliAllocate(m,uVar43 * 0x18 + 0x18);
    }
    if (local_f90 == (HistogramDistance *)0x0) {
      puVar22 = (uint32_t *)0x0;
    }
    else {
      puVar22 = (uint32_t *)BrotliAllocate(m,(long)local_f90 * 4);
      uVar7 = 0;
      do {
        puVar22[uVar7] = (uint32_t)uVar7;
        uVar7 = uVar7 + 1;
      } while (local_f90 != (HistogramDistance *)uVar7);
    }
    sVar35 = BrotliHistogramCombineCommand
                       (local_fe8,puVar10,local_fa0,puVar22,local_f50,(size_t)local_f90,uVar13,0x100
                        ,uVar43);
    BrotliFree(m,local_f50);
    BrotliFree(m,puVar10);
    if (local_f90 == (HistogramDistance *)0x0) {
      local_fd8 = (void *)0x0;
    }
    else {
      local_fd8 = BrotliAllocate(m,(long)local_f90 * 4);
      memset(local_fd8,0xff,(long)local_f90 << 2);
    }
    if (uVar13 != 0) {
      iVar23 = 0;
      uVar43 = 0;
      local_ff0 = 0;
      do {
        memset(local_b40,0,0xb08);
        local_38 = INFINITY;
        if (*(int *)((long)pvVar17 + uVar43 * 4) != 0) {
          uVar7 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar6 + uVar7 * 2 + local_ff0 * 2) * 4) =
                 *(int *)(local_b40 +
                         (ulong)*(ushort *)((long)pvVar6 + uVar7 * 2 + local_ff0 * 2) * 4) + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)((long)pvVar17 + uVar43 * 4));
          local_ff0 = local_ff0 + uVar7;
          local_40 = uVar7;
        }
        lVar40 = 0;
        if (uVar43 != 0) {
          lVar40 = uVar43 - 1;
        }
        uVar38 = local_fa0[lVar40];
        uVar7 = (ulong)uVar38;
        local_fd0 = (HistogramCommand *)
                    BrotliHistogramBitCostDistanceCommand
                              ((HistogramCommand *)local_b40,local_fe8 + uVar7);
        if (sVar35 != 0) {
          sVar24 = 0;
          do {
            dVar45 = BrotliHistogramBitCostDistanceCommand
                               ((HistogramCommand *)local_b40,local_fe8 + puVar22[sVar24]);
            if (dVar45 < (double)local_fd0) {
              uVar7 = (ulong)puVar22[sVar24];
              local_fd0 = (HistogramCommand *)dVar45;
            }
            uVar38 = (uint)uVar7;
            sVar24 = sVar24 + 1;
          } while (sVar35 != sVar24);
        }
        local_fa0[uVar43] = uVar38;
        if (*(int *)((long)local_fd8 + (ulong)uVar38 * 4) == -1) {
          *(int *)((long)local_fd8 + (ulong)uVar38 * 4) = iVar23;
          iVar23 = iVar23 + 1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != uVar13);
    }
    BrotliFree(m,puVar22);
    BrotliFree(m,local_fe8);
    uVar43 = insert_and_copy_split->types_alloc_size;
    if (uVar43 < uVar13) {
      if (uVar43 == 0) {
        uVar43 = uVar13;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar13);
      if (uVar7 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar7);
      }
      if (insert_and_copy_split->types_alloc_size != 0) {
        memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar8;
      insert_and_copy_split->types_alloc_size = uVar7;
    }
    uVar43 = insert_and_copy_split->lengths_alloc_size;
    if (uVar43 < uVar13) {
      if (uVar43 == 0) {
        uVar43 = uVar13;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar13);
      if (uVar7 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      }
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        memcpy(puVar10,insert_and_copy_split->lengths,insert_and_copy_split->lengths_alloc_size << 2
              );
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar10;
      insert_and_copy_split->lengths_alloc_size = uVar7;
    }
    uVar28 = 0;
    if (uVar13 == 0) {
      sVar24 = 1;
      sVar35 = 0;
    }
    else {
      uVar38 = 0;
      sVar35 = 0;
      uVar43 = 0;
      do {
        uVar28 = uVar28 + *(int *)((long)pvVar17 + uVar43 * 4);
        if ((uVar13 - 1 == uVar43) || (local_fa0[uVar43] != local_fa0[uVar43 + 1])) {
          uVar33 = uVar38 & 0xff;
          uVar3 = *(uint *)((long)local_fd8 + (ulong)local_fa0[uVar43] * 4);
          bVar34 = (byte)uVar3;
          insert_and_copy_split->types[sVar35] = bVar34;
          bVar32 = (byte)uVar38;
          uVar38 = uVar3;
          if (bVar34 < bVar32) {
            uVar38 = uVar33;
          }
          insert_and_copy_split->lengths[sVar35] = uVar28;
          sVar35 = sVar35 + 1;
          uVar28 = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar13 != uVar43);
      sVar24 = (ulong)(uVar38 & 0xff) + 1;
    }
    insert_and_copy_split->num_blocks = sVar35;
    insert_and_copy_split->num_types = sVar24;
    BrotliFree(m,local_fd8);
    BrotliFree(m,pvVar17);
    BrotliFree(m,local_fa0);
    BrotliFree(m,pvVar14);
  }
  BrotliFree(m,pvVar6);
  if (num_commands == 0) {
    local_fe8 = (HistogramCommand *)0x0;
    uVar43 = 0;
  }
  else {
    local_fe8 = (HistogramCommand *)BrotliAllocate(m,num_commands * 2);
    puVar11 = &cmds->dist_prefix_;
    uVar43 = 0;
    do {
      if (((*(uint *)(puVar11 + -5) & 0x1ffffff) != 0) && (0x7f < puVar11[-1])) {
        *(uint16_t *)((long)local_fe8 + uVar43 * 2) = *puVar11 & 0x3ff;
        uVar43 = uVar43 + 1;
      }
      puVar11 = puVar11 + 8;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  uVar7 = 0x32;
  if (uVar43 < 0x6a40) {
    uVar7 = uVar43 / 0x220 + 1;
  }
  if (uVar43 == 0) {
    dist_split->num_types = 1;
  }
  else if (uVar43 < 0x80) {
    uVar7 = dist_split->types_alloc_size;
    uVar13 = dist_split->num_blocks + 1;
    if (uVar7 < uVar13) {
      if (uVar7 == 0) {
        uVar7 = uVar13;
      }
      do {
        uVar36 = uVar7;
        uVar7 = uVar36 * 2;
      } while (uVar36 < uVar13);
      if (uVar36 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar36);
      }
      if (dist_split->types_alloc_size != 0) {
        memcpy(puVar8,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar8;
      dist_split->types_alloc_size = uVar36;
    }
    uVar7 = dist_split->lengths_alloc_size;
    uVar13 = dist_split->num_blocks + 1;
    if (uVar7 < uVar13) {
      if (uVar7 == 0) {
        uVar7 = uVar13;
      }
      do {
        uVar36 = uVar7;
        uVar7 = uVar36 * 2;
      } while (uVar36 < uVar13);
      if (uVar36 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar36 * 4);
      }
      if (dist_split->lengths_alloc_size != 0) {
        memcpy(puVar10,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar10;
      dist_split->lengths_alloc_size = uVar36;
    }
    dist_split->num_types = 1;
    dist_split->types[dist_split->num_blocks] = '\0';
    sVar35 = dist_split->num_blocks;
    dist_split->lengths[sVar35] = (uint32_t)uVar43;
    dist_split->num_blocks = sVar35 + 1;
  }
  else {
    pvVar14 = BrotliAllocate(m,uVar7 * 0x890);
    uVar13 = uVar7;
    pvVar6 = pvVar14;
    do {
      memset(pvVar6,0,0x888);
      *(undefined8 *)((long)pvVar6 + 0x888) = 0x7ff0000000000000;
      pvVar6 = (void *)((long)pvVar6 + 0x890);
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    uVar36 = 0;
    uVar13 = 7;
    do {
      uVar15 = (uVar36 * uVar43) / uVar7;
      if (uVar36 != 0) {
        uVar13 = (ulong)(uint)((int)uVar13 * 0x41a7);
        uVar15 = uVar15 + uVar13 % (uVar43 / uVar7);
      }
      if (uVar43 <= uVar15 + 0x28) {
        uVar15 = uVar43 - 0x29;
      }
      plVar2 = (long *)((long)pvVar14 + uVar36 * 0x890 + 0x880);
      *plVar2 = *plVar2 + 0x28;
      lVar40 = 0;
      do {
        piVar1 = (int *)((long)pvVar14 +
                        (ulong)*(ushort *)((long)local_fe8 + lVar40 * 2 + uVar15 * 2) * 4 +
                        uVar36 * 0x890);
        *piVar1 = *piVar1 + 1;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0x28);
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar7);
    uVar13 = (uVar43 * 2) / 0x28 + uVar7 + 99;
    if (uVar13 != uVar13 % uVar7) {
      uVar15 = 7;
      uVar36 = 0;
      do {
        memset(local_b40,0,0x888);
        local_2b8 = INFINITY;
        uVar15 = (ulong)(uint)((int)uVar15 * 0x41a7);
        puVar16 = (ushort *)((long)local_fe8 + (uVar15 % (uVar43 - 0x27)) * 2);
        local_2c0 = 0x28;
        lVar40 = -0x28;
        do {
          uVar4 = *puVar16;
          puVar16 = puVar16 + 1;
          *(int *)(local_b40 + (ulong)uVar4 * 4) = *(int *)(local_b40 + (ulong)uVar4 * 4) + 1;
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0);
        lVar40 = (uVar36 % uVar7) * 0x890;
        plVar2 = (long *)((long)pvVar14 + lVar40 + 0x880);
        *plVar2 = *plVar2 + 0x28;
        lVar26 = 0;
        do {
          piVar1 = (int *)((long)pvVar14 + lVar26 * 4 + lVar40);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x220);
        uVar36 = uVar36 + 1;
      } while (uVar36 < uVar13 - uVar13 % uVar7);
    }
    pvVar6 = BrotliAllocate(m,uVar43);
    pvVar17 = BrotliAllocate(m,uVar7 * 0x1100);
    pvVar18 = BrotliAllocate(m,uVar7 * 8);
    sVar35 = (uVar7 + 7 >> 3) * uVar43;
    if (sVar35 == 0) {
      local_f98 = (void *)0x0;
    }
    else {
      local_f98 = BrotliAllocate(m,sVar35);
    }
    pvVar19 = BrotliAllocate(m,uVar7 * 2);
    lVar40 = 3;
    if (10 < params->quality) {
      lVar40 = 10;
    }
    uVar13 = uVar43 - 1;
    lVar26 = 0;
    do {
      if (uVar7 < 2) {
        memset(pvVar6,0,uVar43);
LAB_00111b78:
        uVar37 = 1;
      }
      else {
        uVar36 = uVar7 + 7 >> 3;
        memset(pvVar17,0,uVar7 * 0x1100);
        uVar15 = 0;
        puVar30 = (uint *)((long)pvVar14 + 0x880);
        do {
          uVar37 = (ulong)*puVar30;
          if (uVar37 < 0x100) {
            dVar45 = (double)kLog2Table[uVar37];
          }
          else {
            dVar45 = log2((double)uVar37);
          }
          *(double *)((long)pvVar17 + uVar15 * 8) = dVar45;
          uVar15 = uVar15 + 1;
          puVar30 = puVar30 + 0x224;
        } while (uVar7 != uVar15);
        pvVar31 = (void *)(uVar7 * 0x10f8 + (long)pvVar17);
        lVar42 = 0x220;
        puVar30 = (uint *)((long)pvVar14 + 0x87c);
        do {
          lVar42 = lVar42 + -1;
          uVar15 = 0;
          puVar39 = puVar30;
          do {
            dVar45 = *(double *)((long)pvVar17 + uVar15 * 8);
            uVar37 = (ulong)*puVar39;
            dVar44 = -2.0;
            if (uVar37 != 0) {
              if (*puVar39 < 0x100) {
                dVar44 = (double)kLog2Table[uVar37];
              }
              else {
                dVar44 = log2((double)uVar37);
              }
            }
            *(double *)((long)pvVar31 + uVar15 * 8) = dVar45 - dVar44;
            uVar15 = uVar15 + 1;
            puVar39 = puVar39 + 0x224;
          } while (uVar7 != uVar15);
          pvVar31 = (void *)((long)pvVar31 + uVar7 * -8);
          puVar30 = puVar30 + -1;
        } while (lVar42 != 0);
        memset(pvVar18,0,uVar7 * 8);
        memset(local_f98,0,uVar36 * uVar43);
        uVar15 = 0;
        do {
          uVar4 = *(ushort *)((long)local_fe8 + uVar15 * 2);
          uVar37 = 0;
          dVar45 = 1e+99;
          do {
            dVar44 = *(double *)((long)pvVar17 + uVar37 * 8 + uVar4 * uVar7 * 8) +
                     *(double *)((long)pvVar18 + uVar37 * 8);
            *(double *)((long)pvVar18 + uVar37 * 8) = dVar44;
            if (dVar44 < dVar45) {
              *(char *)((long)pvVar6 + uVar15) = (char)uVar37;
              dVar45 = dVar44;
            }
            uVar37 = uVar37 + 1;
          } while (uVar7 != uVar37);
          dVar44 = 14.6;
          if (uVar15 < 2000) {
            dVar44 = (((double)(long)uVar15 * 0.07) / 2000.0 + 0.77) * 14.6;
          }
          uVar37 = 0;
          do {
            dVar46 = *(double *)((long)pvVar18 + uVar37 * 8) - dVar45;
            *(double *)((long)pvVar18 + uVar37 * 8) = dVar46;
            if (dVar44 <= dVar46) {
              *(double *)((long)pvVar18 + uVar37 * 8) = dVar44;
              pbVar29 = (byte *)((long)local_f98 + (uVar37 >> 3) + uVar15 * uVar36);
              *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar37 & 7);
            }
            uVar37 = uVar37 + 1;
          } while (uVar7 != uVar37);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar43);
        if (uVar13 == 0) goto LAB_00111b78;
        bVar32 = *(byte *)((long)pvVar6 + uVar13);
        pvVar31 = (void *)((uVar43 - 2) * uVar36 + (long)local_f98);
        uVar37 = 1;
        uVar15 = uVar43;
        do {
          if ((*(byte *)((long)pvVar31 + (ulong)(bVar32 >> 3)) >> (bVar32 & 7) & 1) != 0) {
            bVar34 = *(byte *)((long)pvVar6 + (uVar15 - 2));
            uVar37 = uVar37 + (bVar32 != bVar34);
            bVar32 = bVar34;
          }
          *(byte *)((long)pvVar6 + (uVar15 - 2)) = bVar32;
          pvVar31 = (void *)((long)pvVar31 - uVar36);
          uVar15 = uVar15 - 1;
        } while (uVar15 != 1);
      }
      if (uVar7 != 0) {
        uVar36 = 0;
        do {
          *(undefined2 *)((long)pvVar19 + uVar36 * 2) = 0x100;
          uVar36 = uVar36 + 1;
        } while (uVar7 != uVar36);
      }
      uVar7 = 0;
      uVar4 = 0;
      do {
        if (*(short *)((long)pvVar19 + (ulong)*(byte *)((long)pvVar6 + uVar7) * 2) == 0x100) {
          *(ushort *)((long)pvVar19 + (ulong)*(byte *)((long)pvVar6 + uVar7) * 2) = uVar4;
          uVar4 = uVar4 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar43 != uVar7);
      uVar7 = 0;
      do {
        *(undefined1 *)((long)pvVar6 + uVar7) =
             *(undefined1 *)((long)pvVar19 + (ulong)*(byte *)((long)pvVar6 + uVar7) * 2);
        uVar7 = uVar7 + 1;
      } while (uVar43 != uVar7);
      uVar7 = (ulong)uVar4;
      if (uVar4 != 0) {
        lVar42 = 0;
        do {
          memset((void *)((long)pvVar14 + lVar42),0,0x888);
          *(undefined8 *)((long)pvVar14 + lVar42 + 0x888) = 0x7ff0000000000000;
          lVar42 = lVar42 + 0x890;
        } while (uVar7 * 0x890 != lVar42);
      }
      uVar36 = 0;
      do {
        lVar42 = (ulong)*(byte *)((long)pvVar6 + uVar36) * 0x890;
        piVar1 = (int *)((long)pvVar14 +
                        (ulong)*(ushort *)((long)local_fe8 + uVar36 * 2) * 4 + lVar42);
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar14 + lVar42 + 0x880);
        *plVar2 = *plVar2 + 1;
        uVar36 = uVar36 + 1;
      } while (uVar43 != uVar36);
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar40);
    BrotliFree(m,pvVar17);
    BrotliFree(m,pvVar18);
    BrotliFree(m,local_f98);
    BrotliFree(m,pvVar19);
    BrotliFree(m,pvVar14);
    if (uVar37 == 0) {
      local_fe0 = (uint32_t *)0x0;
      pvVar14 = (void *)0x0;
    }
    else {
      local_fe0 = (uint32_t *)BrotliAllocate(m,uVar37 * 4);
      pvVar14 = BrotliAllocate(m,uVar37 * 4);
    }
    uVar36 = uVar37 * 0x10 + 0x3f0;
    uVar7 = uVar36 >> 6;
    if (uVar36 < 0x40) {
      local_f90 = (HistogramDistance *)0x0;
      puVar10 = (uint32_t *)0x0;
    }
    else {
      local_f90 = (HistogramDistance *)BrotliAllocate(m,uVar7 * 0x890);
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
    }
    if (uVar37 == 0) {
      local_fc8 = (HistogramDistance *)0x0;
    }
    else {
      uVar36 = 0x40;
      if (uVar37 < 0x40) {
        uVar36 = uVar37;
      }
      local_fc8 = (HistogramDistance *)BrotliAllocate(m,uVar36 * 0x890);
    }
    local_f68 = (HistogramPair *)BrotliAllocate(m,0xc018);
    lVar40 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar14,0,uVar37 * 4);
    uVar36 = 0;
    do {
      piVar1 = (int *)((long)pvVar14 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if ((uVar13 == uVar36) ||
         (*(char *)((long)pvVar6 + uVar36) != *(char *)((long)pvVar6 + uVar36 + 1))) {
        lVar40 = lVar40 + 1;
      }
      uVar36 = uVar36 + 1;
    } while (uVar43 != uVar36);
    if (uVar37 == 0) {
      local_fa8 = 0;
    }
    else {
      local_fb0 = (void *)0x0;
      local_f98 = (void *)0x0;
      local_ff0 = 0;
      local_fa8 = 0;
      local_fd0 = (HistogramCommand *)0x0;
      uVar43 = uVar37;
      uVar13 = uVar7;
      puVar22 = local_fe0;
      do {
        uVar36 = 0x40;
        if (uVar43 < 0x40) {
          uVar36 = uVar43;
        }
        lVar26 = uVar36 + (uVar36 == 0);
        lVar40 = 0;
        do {
          pHVar20 = local_fc8 + lVar40;
          memset(pHVar20,0,0x888);
          local_fc8[lVar40].bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar14 + (local_ff0 + lVar40) * 4) != 0) {
            sVar35 = pHVar20->total_count_;
            uVar36 = 0;
            do {
              pHVar20->data_[*(ushort *)((long)local_fe8 + uVar36 * 2 + (long)local_fd0 * 2)] =
                   pHVar20->data_[*(ushort *)((long)local_fe8 + uVar36 * 2 + (long)local_fd0 * 2)] +
                   1;
              uVar36 = uVar36 + 1;
            } while (uVar36 < *(uint *)((long)pvVar14 + (local_ff0 + lVar40) * 4));
            pHVar20->total_count_ = sVar35 + uVar36;
            local_fd0 = (HistogramCommand *)((long)local_fd0 + uVar36);
          }
          dVar45 = BrotliPopulationCostDistance(pHVar20);
          pHVar20->bit_cost_ = dVar45;
          new_clusters[lVar40] = (uint32_t)lVar40;
          symbols[lVar40] = (uint32_t)lVar40;
          sizes[lVar40] = 1;
          lVar40 = lVar40 + 1;
        } while (lVar40 != lVar26);
        sVar35 = uVar37 - local_ff0;
        if (0x3f < sVar35) {
          sVar35 = 0x40;
        }
        sVar35 = BrotliHistogramCombineDistance
                           (local_fc8,sizes,symbols,new_clusters,local_f68,sVar35,sVar35,0x40,0x800)
        ;
        uVar36 = (long)local_fb0 + sVar35;
        if (uVar13 < uVar36) {
          uVar15 = uVar13;
          if (uVar13 == 0) {
            uVar15 = uVar36;
          }
          do {
            uVar27 = uVar15;
            uVar15 = uVar27 * 2;
          } while (uVar27 < uVar36);
          if (uVar27 == 0) {
            pHVar20 = (HistogramDistance *)0x0;
          }
          else {
            pHVar20 = (HistogramDistance *)BrotliAllocate(m,uVar27 * 0x890);
          }
          if (uVar13 != 0) {
            memcpy(pHVar20,local_f90,uVar13 * 0x890);
          }
          BrotliFree(m,local_f90);
          uVar13 = uVar27;
          local_f90 = pHVar20;
        }
        uVar36 = (long)local_f98 + sVar35;
        if (uVar7 < uVar36) {
          uVar15 = uVar7;
          if (uVar7 == 0) {
            uVar15 = uVar36;
          }
          do {
            uVar27 = uVar15;
            uVar15 = uVar27 * 2;
          } while (uVar27 < uVar36);
          if (uVar27 == 0) {
            puVar21 = (uint32_t *)0x0;
          }
          else {
            puVar21 = (uint32_t *)BrotliAllocate(m,uVar27 * 4);
          }
          if (uVar7 != 0) {
            memcpy(puVar21,puVar10,uVar7 << 2);
          }
          BrotliFree(m,puVar10);
          uVar7 = uVar27;
          puVar10 = puVar21;
        }
        if (sVar35 != 0) {
          pHVar20 = local_f90 + (long)local_fb0;
          sVar24 = 0;
          do {
            uVar38 = new_clusters[sVar24];
            memcpy(pHVar20,local_fc8 + uVar38,0x890);
            puVar10[(long)local_f98 + sVar24] = sizes[uVar38];
            remap[new_clusters[sVar24]] = (uint32_t)sVar24;
            sVar24 = sVar24 + 1;
            pHVar20 = pHVar20 + 1;
          } while (sVar35 != sVar24);
          local_fb0 = (void *)((long)local_fb0 + sVar24);
          local_f98 = (void *)((long)local_f98 + sVar24);
        }
        lVar40 = 0;
        do {
          puVar22[lVar40] = remap[symbols[lVar40]] + (int)local_fa8;
          lVar40 = lVar40 + 1;
        } while (lVar26 != lVar40);
        local_fa8 = local_fa8 + sVar35;
        local_ff0 = local_ff0 + 0x40;
        uVar43 = uVar43 - 0x40;
        puVar22 = puVar22 + 0x40;
      } while (local_ff0 < uVar37);
    }
    BrotliFree(m,local_fc8);
    uVar43 = (local_fa8 >> 1) * local_fa8;
    if (local_fa8 << 6 < uVar43) {
      uVar43 = local_fa8 << 6;
    }
    if (0x800 < uVar43) {
      BrotliFree(m,local_f68);
      local_f68 = (HistogramPair *)BrotliAllocate(m,uVar43 * 0x18 + 0x18);
    }
    if (local_fa8 == 0) {
      puVar22 = (uint32_t *)0x0;
    }
    else {
      puVar22 = (uint32_t *)BrotliAllocate(m,local_fa8 * 4);
      uVar7 = 0;
      do {
        puVar22[uVar7] = (uint32_t)uVar7;
        uVar7 = uVar7 + 1;
      } while (local_fa8 != uVar7);
    }
    sVar35 = BrotliHistogramCombineDistance
                       (local_f90,puVar10,local_fe0,puVar22,local_f68,local_fa8,uVar37,0x100,uVar43)
    ;
    BrotliFree(m,local_f68);
    BrotliFree(m,puVar10);
    if (local_fa8 == 0) {
      pvVar17 = (void *)0x0;
    }
    else {
      pvVar17 = BrotliAllocate(m,local_fa8 * 4);
      memset(pvVar17,0xff,local_fa8 << 2);
    }
    if (uVar37 != 0) {
      iVar23 = 0;
      uVar43 = 0;
      local_fd8 = (void *)0x0;
      do {
        memset(local_b40,0,0x888);
        local_2b8 = INFINITY;
        if (*(int *)((long)pvVar14 + uVar43 * 4) != 0) {
          uVar7 = 0;
          do {
            *(int *)(local_b40 +
                    (ulong)*(ushort *)((long)local_fe8 + uVar7 * 2 + (long)local_fd8 * 2) * 4) =
                 *(int *)(local_b40 +
                         (ulong)*(ushort *)((long)local_fe8 + uVar7 * 2 + (long)local_fd8 * 2) * 4)
                 + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)((long)pvVar14 + uVar43 * 4));
          local_fd8 = (void *)((long)local_fd8 + uVar7);
          local_2c0 = uVar7;
        }
        lVar40 = 0;
        if (uVar43 != 0) {
          lVar40 = uVar43 - 1;
        }
        uVar38 = local_fe0[lVar40];
        uVar7 = (ulong)uVar38;
        local_fd0 = (HistogramCommand *)
                    BrotliHistogramBitCostDistanceDistance
                              ((HistogramDistance *)local_b40,local_f90 + uVar7);
        if (sVar35 != 0) {
          sVar24 = 0;
          do {
            dVar45 = BrotliHistogramBitCostDistanceDistance
                               ((HistogramDistance *)local_b40,local_f90 + puVar22[sVar24]);
            if (dVar45 < (double)local_fd0) {
              uVar7 = (ulong)puVar22[sVar24];
              local_fd0 = (HistogramCommand *)dVar45;
            }
            uVar38 = (uint)uVar7;
            sVar24 = sVar24 + 1;
          } while (sVar35 != sVar24);
        }
        local_fe0[uVar43] = uVar38;
        if (*(int *)((long)pvVar17 + (ulong)uVar38 * 4) == -1) {
          *(int *)((long)pvVar17 + (ulong)uVar38 * 4) = iVar23;
          iVar23 = iVar23 + 1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != uVar37);
    }
    BrotliFree(m,puVar22);
    BrotliFree(m,local_f90);
    uVar43 = dist_split->types_alloc_size;
    if (uVar43 < uVar37) {
      if (uVar43 == 0) {
        uVar43 = uVar37;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar37);
      if (uVar7 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar7);
      }
      if (dist_split->types_alloc_size != 0) {
        memcpy(puVar8,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar8;
      dist_split->types_alloc_size = uVar7;
    }
    uVar43 = dist_split->lengths_alloc_size;
    if (uVar43 < uVar37) {
      if (uVar43 == 0) {
        uVar43 = uVar37;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar37);
      if (uVar7 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      }
      if (dist_split->lengths_alloc_size != 0) {
        memcpy(puVar10,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar10;
      dist_split->lengths_alloc_size = uVar7;
    }
    uVar28 = 0;
    if (uVar37 == 0) {
      sVar24 = 1;
      sVar35 = 0;
    }
    else {
      uVar38 = 0;
      sVar35 = 0;
      uVar43 = 0;
      do {
        uVar28 = uVar28 + *(int *)((long)pvVar14 + uVar43 * 4);
        if ((uVar37 - 1 == uVar43) || (local_fe0[uVar43] != local_fe0[uVar43 + 1])) {
          uVar33 = uVar38 & 0xff;
          uVar3 = *(uint *)((long)pvVar17 + (ulong)local_fe0[uVar43] * 4);
          bVar34 = (byte)uVar3;
          dist_split->types[sVar35] = bVar34;
          bVar32 = (byte)uVar38;
          uVar38 = uVar3;
          if (bVar34 < bVar32) {
            uVar38 = uVar33;
          }
          dist_split->lengths[sVar35] = uVar28;
          sVar35 = sVar35 + 1;
          uVar28 = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar37 != uVar43);
      sVar24 = (ulong)(uVar38 & 0xff) + 1;
    }
    dist_split->num_blocks = sVar35;
    dist_split->num_types = sVar24;
    BrotliFree(m,pvVar17);
    BrotliFree(m,pvVar14);
    BrotliFree(m,local_fe0);
    BrotliFree(m,pvVar6);
  }
  BrotliFree(m,local_fe8);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
       Literal histograms have alphabet size 256. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}